

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O2

Mig_Obj_t * Mig_ManObj(Mig_Man_t *p,int v)

{
  void *pvVar1;
  
  if ((-1 < v) && (v < p->nObjs)) {
    pvVar1 = Vec_PtrEntry(&p->vPages,(uint)v >> 0xc);
    return (Mig_Obj_t *)((long)pvVar1 + (ulong)((v & 0xfffU) << 4));
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
}

Assistant:

static inline Mig_Obj_t *  Mig_ManObj( Mig_Man_t * p, int v )  { assert(v >= 0 && v < p->nObjs);  return Mig_ManPage(p, v) + Mig_IdCell(v); }